

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::ProfiledLoopBodyStart<true,false>
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,bool isFirstIteration
          )

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *functionBody;
  undefined4 *puVar3;
  ThreadContext *pTVar4;
  bool isFirstIteration_local;
  LayoutSize layoutSize_local;
  uint32 loopNumber_local;
  InterpreterStackFrame *this_local;
  
  functionBody = GetFunctionBody(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1715,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DoInterruptProbe(this);
  bVar2 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(*(ScriptContext **)(this + 0x78))
  ;
  if (bVar2) {
    pTVar4 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
    TTD::ExecutionInfoManager::UpdateLoopCountInfo(pTVar4->TTDExecutionInfo);
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledLoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, bool isFirstIteration)
    {
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));

        if (InterruptProbe)
        {
            this->DoInterruptProbe();
        }

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->UpdateLoopCountInfo();
        }
#endif

        if (!JITLoopBody || this->IsInCatchOrFinallyBlock())
        {
            // For functions having try-catch-finally, jit loop bodies for loops that are contained only in a try block,
            // not even indirect containment in a Catch or Finally.
            return;
        }

        LoopHeader const * loopHeader = DoLoopBodyStart(loopNumber, layoutSize, false, isFirstIteration);
        Assert(loopHeader == nullptr || this->m_functionBody->GetLoopNumber(loopHeader) == loopNumber);
        if (loopHeader != nullptr)
        {
            // We executed jitted loop body, no implicit call information available for this loop
            uint currentOffset = m_reader.GetCurrentOffset();

            if (!loopHeader->Contains(currentOffset) || (m_reader.PeekOp() == OpCode::ProfiledLoopEnd))
            {
                // Restore the outer loop's implicit call flags
                scriptContext->GetThreadContext()->SetImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);
            }
            else
            {
                // We bailout from the loop, just continue collect implicit call flags for this loop
            }
        }
    }